

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O0

void char_to_room(CHAR_DATA *ch,ROOM_INDEX_DATA *pRoomIndex)

{
  AREA_DATA_conflict *pAVar1;
  string_view fmt;
  bool bVar2;
  ROOM_INDEX_DATA *pRVar3;
  CHAR_DATA *in_RSI;
  CHAR_DATA *in_RDI;
  __type_conflict2 _Var4;
  AFFECT_DATA *af;
  ROOM_INDEX_DATA *room;
  OBJ_DATA *obj;
  char *in_stack_00001258;
  CHAR_DATA *in_stack_00001260;
  CHAR_DATA *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  ulong uVar5;
  CHAR_DATA *in_stack_ffffffffffffffc8;
  int vnum;
  AFFECT_DATA *pAVar6;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffd0;
  CLogger *in_stack_ffffffffffffffe0;
  ROOM_INDEX_DATA *in_stack_ffffffffffffffe8;
  OBJ_DATA *pOVar7;
  
  if (in_RSI == (CHAR_DATA *)0x0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8);
    vnum = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
    fmt._M_str = (char *)in_RSI;
    fmt._M_len = (size_t)in_stack_ffffffffffffffe8;
    CLogger::Debug<>(in_stack_ffffffffffffffe0,fmt);
    pRVar3 = get_room_index(vnum);
    if (pRVar3 != (ROOM_INDEX_DATA *)0x0) {
      char_to_room(in_RSI,in_stack_ffffffffffffffe8);
    }
  }
  else {
    in_RDI->in_room = (ROOM_INDEX_DATA *)in_RSI;
    in_RDI->next_in_room = in_RSI->leader;
    in_RSI->leader = in_RDI;
    bVar2 = is_npc(in_stack_ffffffffffffffb8);
    if (bVar2) {
      if (in_RDI->home_room == (ROOM_INDEX_DATA *)0x0) {
        in_RDI->home_room = (ROOM_INDEX_DATA *)in_RSI;
      }
    }
    else {
      if ((in_RDI->in_room->area->empty & 1U) != 0) {
        in_RDI->in_room->area->empty = false;
      }
      pAVar1 = in_RDI->in_room->area;
      pAVar1->nplayer = pAVar1->nplayer + 1;
    }
    for (pOVar7 = in_RDI->carrying; pOVar7 != (OBJ_DATA *)0x0; pOVar7 = pOVar7->next_content) {
      if ((pOVar7->wear_loc != -1) &&
         (((pOVar7->item_type == 1 ||
           (bVar2 = is_obj_stat((OBJ_DATA *)in_stack_ffffffffffffffc8,
                                (int)((ulong)in_stack_ffffffffffffffc0 >> 0x20)), bVar2)) &&
          (in_RDI->in_room != (ROOM_INDEX_DATA *)0x0)))) {
        in_RDI->in_room->light = in_RDI->in_room->light + 3;
      }
    }
    uVar5 = in_RDI->progtypes[0];
    _Var4 = std::pow<int,int>(0,0x5f8ab3);
    if ((uVar5 & (long)_Var4) != 0) {
      in_RDI->in_room->move_progs = true;
    }
    bVar2 = is_affected_by(in_stack_ffffffffffffffc8,(int)(uVar5 >> 0x20));
    if (bVar2) {
      for (pAVar6 = in_RDI->affected;
          (pAVar6 != (AFFECT_DATA *)0x0 && (pAVar6->tick_fun != plague_tick)); pAVar6 = pAVar6->next
          ) {
      }
      if (pAVar6 == (AFFECT_DATA *)0x0) {
        _Var4 = std::pow<int,int>(0,0x5f8b43);
        in_RDI->affected_by[0] = ((long)_Var4 ^ 0xffffffffffffffffU) & in_RDI->affected_by[0];
        return;
      }
    }
    bVar2 = IS_ZERO_VECTOR(in_RDI->in_room->affected_by);
    if (((!bVar2) || ((in_RDI->in_room->has_rune & 1U) != 0)) &&
       (bVar2 = is_immortal(in_stack_ffffffffffffffb8), bVar2)) {
      do_raffects(in_stack_00001260,in_stack_00001258);
    }
  }
  return;
}

Assistant:

void char_to_room(CHAR_DATA *ch, ROOM_INDEX_DATA *pRoomIndex)
{
	OBJ_DATA *obj;

	if (pRoomIndex == nullptr)
	{
		ROOM_INDEX_DATA *room;

		RS.Logger.Debug("Char_to_room: nullptr.");

		if ((room = get_room_index(ROOM_VNUM_TEMPLE)) != nullptr)
			char_to_room(ch, room);

		return;
	}

	ch->in_room = pRoomIndex;
	ch->next_in_room = pRoomIndex->people;
	pRoomIndex->people = ch;

	if (!is_npc(ch))
	{
		/* this is crashing us */
		if (ch->in_room->area->empty)
			ch->in_room->area->empty= false;

		++ch->in_room->area->nplayer;
	}
	else
	{
		if (ch->home_room == nullptr)
			ch->home_room = pRoomIndex;
	}

	for (obj = ch->carrying; obj; obj = obj->next_content)
	{
		if (obj->wear_loc != WEAR_NONE)
		{
			if ((obj->item_type == ITEM_LIGHT || is_obj_stat(obj, ITEM_GLOW)) && ch->in_room)
				ch->in_room->light += 3;
		}
	}

	if (IS_SET(ch->progtypes, MPROG_MOVE))
		ch->in_room->move_progs = true;

	if (is_affected_by(ch, AFF_PLAGUE))
	{
		AFFECT_DATA *af;

		for (af = ch->affected; af; af = af->next)
		{
			if (af->tick_fun == plague_tick)
			{
				break;
			}
		}

		if (!af)
		{
			REMOVE_BIT(ch->affected_by, AFF_PLAGUE);
			return;
		}
	}

	if ((!IS_ZERO_VECTOR(ch->in_room->affected_by) || ch->in_room->has_rune) && is_immortal(ch))
		do_raffects(ch, "");
}